

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int testC(lua_State *L)

{
  int iVar1;
  lua_State *L1;
  char *pc;
  int arg;
  
  arg = 1;
  iVar1 = lua_isuserdata(L,1);
  if (iVar1 == 0) {
    iVar1 = lua_type(L,1);
    L1 = L;
    if (iVar1 != 8) goto LAB_001344cf;
    L1 = lua_tothread(L,1);
  }
  else {
    L1 = getstate(L);
  }
  arg = 2;
LAB_001344cf:
  pc = luaL_checklstring(L,arg,(size_t *)0x0);
  iVar1 = runC(L,L1,pc);
  return iVar1;
}

Assistant:

static int testC (lua_State *L) {
  lua_State *L1;
  const char *pc;
  if (lua_isuserdata(L, 1)) {
    L1 = getstate(L);
    pc = luaL_checkstring(L, 2);
  }
  else if (lua_isthread(L, 1)) {
    L1 = lua_tothread(L, 1);
    pc = luaL_checkstring(L, 2);
  }
  else {
    L1 = L;
    pc = luaL_checkstring(L, 1);
  }
  return runC(L, L1, pc);
}